

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfDeepTiledInputFile.cpp
# Opt level: O0

void __thiscall
Imf_3_3::anon_unknown_14::TileProcess::copy_sample_count
          (TileProcess *this,DeepFrameBuffer *outfb,int fb_absX,int fb_absY,int t_absX,int t_absY)

{
  size_t sVar1;
  size_t sVar2;
  Slice *pSVar3;
  undefined8 uVar4;
  void *__src;
  DeepFrameBuffer *in_RSI;
  long in_RDI;
  int in_R8D;
  int in_R9D;
  int x;
  uint8_t *lineptr;
  int32_t *counts;
  int y;
  int64_t yS;
  int64_t xS;
  int yOffset;
  int xOffset;
  Slice *s;
  uint8_t *ptr;
  char *in_stack_ffffffffffffff68;
  undefined4 in_stack_ffffffffffffff70;
  undefined4 in_stack_ffffffffffffff74;
  int local_74;
  char *local_70;
  int local_5c;
  char *local_28;
  
  pSVar3 = DeepFrameBuffer::getSampleCountSlice(in_RSI);
  if ((pSVar3->xSampling == 1) && (pSVar3->ySampling == 1)) {
    if ((pSVar3->xTileCoords & 1U) != 0) {
      in_R8D = 0;
    }
    if ((pSVar3->yTileCoords & 1U) != 0) {
      in_R9D = 0;
    }
    local_28 = pSVar3->base + (long)in_R9D * pSVar3->yStride + (long)in_R8D * pSVar3->xStride;
    sVar1 = pSVar3->xStride;
    sVar2 = pSVar3->yStride;
    for (local_5c = 0; local_5c < *(int *)(in_RDI + 0x14); local_5c = local_5c + 1) {
      __src = (void *)(*(long *)(in_RDI + 0xf0) + (long)(local_5c * *(int *)(in_RDI + 0x18)) * 4);
      if (sVar1 == 4) {
        memcpy(local_28,__src,(long)*(int *)(in_RDI + 0x18) << 2);
      }
      else {
        local_70 = local_28;
        for (local_74 = 0; local_74 < *(int *)(in_RDI + 0x18); local_74 = local_74 + 1) {
          *(undefined4 *)local_70 = *(undefined4 *)((long)__src + (long)local_74 * 4);
          local_70 = local_70 + sVar1;
        }
      }
      local_28 = local_28 + sVar2;
    }
    return;
  }
  uVar4 = __cxa_allocate_exception(0x48);
  Iex_3_3::ArgExc::ArgExc
            ((ArgExc *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
             in_stack_ffffffffffffff68);
  __cxa_throw(uVar4,&Iex_3_3::ArgExc::typeinfo,Iex_3_3::ArgExc::~ArgExc);
}

Assistant:

void TileProcess::copy_sample_count (
    const DeepFrameBuffer *outfb,
    int fb_absX, int fb_absY,
    int t_absX, int t_absY)
{
    uint8_t*     ptr;
    const Slice& s = outfb->getSampleCountSlice ();
    if (s.xSampling != 1 || s.ySampling != 1)
        throw IEX_NAMESPACE::ArgExc ("Tiled data should not have subsampling.");

    int xOffset = s.xTileCoords ? 0 : t_absX;
    int yOffset = s.yTileCoords ? 0 : t_absY;

    ptr  = reinterpret_cast<uint8_t*> (s.base);
    ptr += int64_t (xOffset) * int64_t (s.xStride);
    ptr += int64_t (yOffset) * int64_t (s.yStride);

    int64_t xS = int64_t (s.xStride);
    int64_t yS = int64_t (s.yStride);

    for ( int y = 0; y < cinfo.height; ++y )
    {
        const int32_t* counts = decoder.sample_count_table + y * cinfo.width;

        if (xS == sizeof(int32_t))
        {
            memcpy (ptr, counts, cinfo.width * sizeof(int32_t));
        }
        else
        {
            uint8_t* lineptr = ptr;
            for ( int x = 0; x < cinfo.width; ++x )
            {
                *((int32_t *)lineptr) = counts[x];
                lineptr += xS;
            }
        }
        ptr += yS;
    }
}